

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O3

void CBinds::ConfigSaveCallback(IConfigManager *pConfigManager,void *pUserData)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint j;
  char *pcVar7;
  char (*pacVar8) [20];
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  int m;
  long lVar12;
  long in_FS_OFFSET;
  char aBind [256];
  char aBuffer [512];
  char local_338 [256];
  char local_238 [512];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar9 = (char *)((long)pUserData + 0x29);
  lVar11 = 0;
  do {
    lVar12 = 0;
    pcVar10 = pcVar9;
    do {
      cVar1 = *(char *)((long)pUserData + lVar12 * 0x80 + lVar11 * 0x200 + 0x28);
      if (cVar1 != '\0') {
        lVar5 = 0;
        pcVar3 = pcVar10;
        pcVar7 = local_338;
        do {
          if ((cVar1 == '\\') || (lVar6 = lVar5, cVar1 == '\"')) {
            lVar6 = lVar5 + 1;
            *pcVar7 = '\\';
          }
          pcVar7 = local_338 + lVar6 + 1;
          local_338[lVar6] = cVar1;
          cVar1 = *pcVar3;
          if (cVar1 == '\0') break;
          lVar5 = lVar6 + 1;
          pcVar3 = pcVar3 + 1;
        } while (lVar6 < 0xfe);
        *pcVar7 = '\0';
        uVar2 = (int)lVar12 - 1;
        pcVar3 = "";
        if (uVar2 < 3) {
          pcVar3 = (&PTR_anon_var_dwarf_3da52_00211a30)[uVar2];
        }
        str_format(local_238,0x200,"bind %s%s \"%s\"",pcVar3,g_aaKeyStrings + lVar11,local_338);
        (*(pConfigManager->super_IInterface)._vptr_IInterface[8])(pConfigManager,local_238);
      }
      lVar12 = lVar12 + 1;
      pcVar10 = pcVar10 + 0x80;
    } while (lVar12 != 4);
    lVar11 = lVar11 + 1;
    pcVar9 = pcVar9 + 0x200;
    if (lVar11 == 0x1da) {
      lVar11 = 0;
      do {
        uVar2 = s_aaDefaultBindKeys[lVar11][0];
        if (*(char *)((long)pUserData +
                     (long)s_aaDefaultBindKeys[lVar11][1] * 0x80 + (long)(int)uVar2 * 0x200 + 0x28)
            == '\0') {
          uVar4 = s_aaDefaultBindKeys[lVar11][1] - 1;
          pcVar9 = "";
          if (uVar4 < 3) {
            pcVar9 = (&PTR_anon_var_dwarf_3da52_00211a30)[uVar4];
          }
          pacVar8 = g_aaKeyStrings + (int)uVar2;
          if (0x1ff < uVar2) {
            pacVar8 = g_aaKeyStrings;
          }
          str_format(local_238,0x200,"unbind %s%s",pcVar9,pacVar8);
          (*(pConfigManager->super_IInterface)._vptr_IInterface[8])(pConfigManager,local_238);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x1d);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

void CBinds::ConfigSaveCallback(IConfigManager *pConfigManager, void *pUserData)
{
	CBinds *pSelf = (CBinds *)pUserData;

	char aBuffer[512];
	for(int i = 0; i < KEY_LAST; i++)
	{
		for(int m = 0; m < MODIFIER_COUNT; m++)
		{
			if(pSelf->m_aaaKeyBindings[i][m][0] == 0)
				continue;

			// process the string. we need to escape some characters
			char aBind[2*BIND_LENGTH];
			const char *pSrc = pSelf->m_aaaKeyBindings[i][m];
			const char *pEnd = aBind + sizeof(aBind) - 1;
			char *pDst = aBind;
			while(*pSrc && pDst < pEnd)
			{
				if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
					*pDst++ = '\\';
				*pDst++ = *pSrc++;
			}
			*pDst = 0;

			str_format(aBuffer, sizeof(aBuffer), "bind %s%s \"%s\"", GetModifierName(m), pSelf->Input()->KeyName(i), aBind);
			pConfigManager->WriteLine(aBuffer);
		}
	}

	for(unsigned j = 0; j < sizeof(s_aaDefaultBindKeys)/sizeof(int)/2; j++)
	{
		const int Key = s_aaDefaultBindKeys[j][0];
		const int Modifier = s_aaDefaultBindKeys[j][1];
		if(pSelf->m_aaaKeyBindings[Key][Modifier][0] == 0)
		{
			// explicitly unbind keys that were unbound by the user
			str_format(aBuffer, sizeof(aBuffer), "unbind %s%s", GetModifierName(Modifier), pSelf->Input()->KeyName(Key));
			pConfigManager->WriteLine(aBuffer);
		}
	}
}